

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall mocker::CompileError::~CompileError(CompileError *this)

{
  CompileError *this_local;
  
  ~CompileError(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

CompileError(Position beg, Position end) : beg(beg), end(end) {
    using std::to_string;
    msg = "An error occurs between line " + to_string(beg.line) + ", column " +
          to_string(beg.col) + " and line " + to_string(end.line) +
          ", column " + to_string(end.col);
  }